

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O2

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::InstanceKinematicsScene>::~PointerArray
          (PointerArray<COLLADAFW::InstanceKinematicsScene> *this)

{
  this->_vptr_PointerArray = (_func_int **)&PTR__PointerArray_00a04c90;
  deleteContents(this);
  ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>::~ArrayPrimitiveType
            (&this->super_ArrayPrimitiveType<COLLADAFW::InstanceKinematicsScene_*>);
  return;
}

Assistant:

virtual ~PointerArray()
		{
			deleteContents();
		}